

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O1

void __thiscall
linq::
IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>::
iterator::iterator(iterator *this,
                  GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int> *src,
                  bool v)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->source).super_IState<linq::IGrouping<bool,_int_&>_>._vptr_IState =
       (_func_int **)&PTR_Init_001585e0;
  (this->source).source.source.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00157b88;
  (this->source).source.source.state.
  super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (src->source).source.state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  p_Var1 = (src->source).source.state.
           super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->source).source.source.state.
  super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  std::function<bool_(const_int_&)>::function(&(this->source).transformer,&src->transformer);
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::_Rb_tree(&(this->source).result._M_t,&(src->result)._M_t);
  (this->source).current._M_node = (src->current)._M_node;
  this->valid = v;
  if (v) {
    GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>::Init(&this->source);
    this->valid = (_Rb_tree_header *)(this->source).current._M_node !=
                  &(this->source).result._M_t._M_impl.super__Rb_tree_header;
  }
  return;
}

Assistant:

iterator(S src, bool v = true) : source(src) {
				valid = v;
				
				if(v) { 
					source.Init();	
					valid = source.Valid();
				}
			}